

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void av1_dr_prediction_z3_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  int in_ECX;
  int in_EDX;
  uint8_t *in_stack_00000058;
  int in_stack_000000a0;
  int in_stack_000000a4;
  uint8_t *in_stack_000000a8;
  ptrdiff_t in_stack_000000b0;
  uint8_t *in_stack_000000b8;
  int in_stack_000000e0;
  int in_stack_000000e4;
  uint8_t *in_stack_000000e8;
  int in_stack_000000f0;
  int in_stack_000000f4;
  uint8_t *in_stack_000000f8;
  ptrdiff_t in_stack_00000100;
  uint8_t *in_stack_00000108;
  int in_stack_00000110;
  int in_stack_00000114;
  uint8_t *in_stack_00000118;
  ptrdiff_t in_stack_00000120;
  uint8_t *in_stack_00000128;
  int in_stack_000001b0;
  int in_stack_000001b4;
  uint8_t *in_stack_000001b8;
  ptrdiff_t in_stack_000001c0;
  uint8_t *in_stack_000001c8;
  int in_stack_00000220;
  int in_stack_00000224;
  uint8_t *in_stack_00000228;
  ptrdiff_t in_stack_00000230;
  uint8_t *in_stack_00000238;
  int in_stack_00000290;
  int in_stack_00000294;
  uint8_t *in_stack_00000298;
  ptrdiff_t in_stack_000002a0;
  uint8_t *in_stack_000002a8;
  int in_stack_000002c0;
  int in_stack_000002c4;
  uint8_t *in_stack_000002c8;
  ptrdiff_t in_stack_000002d0;
  uint8_t *in_stack_000002d8;
  int in_stack_000003a8;
  int in_stack_000003ac;
  int in_stack_000003b0;
  int in_stack_000003b4;
  uint8_t *in_stack_000003b8;
  int in_stack_000003c0;
  int in_stack_000003c4;
  uint8_t *in_stack_000003c8;
  ptrdiff_t in_stack_000003d0;
  uint8_t *in_stack_000003d8;
  int in_stack_000003e0;
  int in_stack_000003e4;
  uint8_t *in_stack_000003e8;
  ptrdiff_t in_stack_000003f0;
  uint8_t *in_stack_000003f8;
  int in_stack_000004c0;
  int in_stack_000004c4;
  uint8_t *in_stack_000004c8;
  ptrdiff_t in_stack_000004d0;
  uint8_t *in_stack_000004d8;
  int in_stack_000007a8;
  int in_stack_000007ac;
  int in_stack_000007b0;
  int in_stack_000007b4;
  uint8_t *in_stack_000007b8;
  uint8_t *in_stack_000007c0;
  uint8_t *in_stack_000007c8;
  int in_stack_00000fa8;
  int in_stack_00000fac;
  uint8_t *in_stack_00000fb0;
  ptrdiff_t in_stack_00000fb8;
  uint8_t *in_stack_00000fc0;
  
  if (in_EDX == in_ECX) {
    if (in_EDX == 4) {
      dr_prediction_z3_4x4_sse4_1(in_stack_00000058,(ptrdiff_t)dst,(uint8_t *)stride,bw,bh);
    }
    else if (in_EDX == 8) {
      dr_prediction_z3_8x8_sse4_1
                (in_stack_000000f8,CONCAT44(in_stack_000000f4,in_stack_000000f0),in_stack_000000e8,
                 in_stack_000000e4,in_stack_000000e0);
    }
    else if (in_EDX == 0x10) {
      dr_prediction_z3_16x16_sse4_1
                (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,
                 in_stack_000001b0);
    }
    else if (in_EDX == 0x20) {
      dr_prediction_z3_32x32_sse4_1
                (in_stack_000007c8,(ptrdiff_t)in_stack_000007c0,in_stack_000007b8,in_stack_000007b4,
                 in_stack_000007b0);
    }
    else if (in_EDX == 0x40) {
      dr_prediction_z3_64x64_sse4_1
                (in_stack_00000fc0,in_stack_00000fb8,in_stack_00000fb0,in_stack_00000fac,
                 in_stack_00000fa8);
    }
  }
  else if (in_EDX < in_ECX) {
    if (in_EDX * 2 == in_ECX) {
      switch(in_EDX) {
      case 4:
        dr_prediction_z3_4x8_sse4_1
                  (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,
                   in_stack_000000a0);
        break;
      default:
        break;
      case 8:
        dr_prediction_z3_8x16_sse4_1
                  (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000114,
                   in_stack_00000110);
        break;
      case 0x10:
        dr_prediction_z3_16x32_sse4_1
                  (in_stack_000003c8,CONCAT44(in_stack_000003c4,in_stack_000003c0),in_stack_000003b8
                   ,in_stack_000003b4,in_stack_000003b0);
        break;
      case 0x20:
        dr_prediction_z3_32x64_sse4_1
                  (in_stack_000007c0,(ptrdiff_t)in_stack_000007b8,
                   (uint8_t *)CONCAT44(in_stack_000007b4,in_stack_000007b0),in_stack_000007ac,
                   in_stack_000007a8);
      }
    }
    else if (in_EDX == 4) {
      dr_prediction_z3_4x16_sse4_1
                (in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f4,
                 in_stack_000000f0);
    }
    else if (in_EDX == 8) {
      dr_prediction_z3_8x32_sse4_1
                (in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c4,
                 in_stack_000003c0);
    }
    else if (in_EDX == 0x10) {
      dr_prediction_z3_16x64_sse4_1
                ((uint8_t *)CONCAT44(in_stack_000003c4,in_stack_000003c0),
                 (ptrdiff_t)in_stack_000003b8,
                 (uint8_t *)CONCAT44(in_stack_000003b4,in_stack_000003b0),in_stack_000003ac,
                 in_stack_000003a8);
    }
  }
  else if (in_ECX * 2 == in_EDX) {
    switch(in_ECX) {
    case 4:
      dr_prediction_z3_8x4_sse4_1
                (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,
                 in_stack_000000a0);
      break;
    default:
      break;
    case 8:
      dr_prediction_z3_16x8_sse4_1
                (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000294,
                 in_stack_00000290);
      break;
    case 0x10:
      dr_prediction_z3_32x16_sse4_1
                (in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,in_stack_000002c4,
                 in_stack_000002c0);
      break;
    case 0x20:
      dr_prediction_z3_64x32_sse4_1
                (in_stack_000007c0,(ptrdiff_t)in_stack_000007b8,
                 (uint8_t *)CONCAT44(in_stack_000007b4,in_stack_000007b0),in_stack_000007ac,
                 in_stack_000007a8);
    }
  }
  else if (in_ECX == 4) {
    dr_prediction_z3_16x4_sse4_1
              (in_stack_00000238,in_stack_00000230,in_stack_00000228,in_stack_00000224,
               in_stack_00000220);
  }
  else if (in_ECX == 8) {
    dr_prediction_z3_32x8_sse4_1
              (in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,in_stack_000003e4,
               in_stack_000003e0);
  }
  else if (in_ECX == 0x10) {
    dr_prediction_z3_64x16_sse4_1
              (in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,in_stack_000004c4,
               in_stack_000004c0);
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      default: assert(0 && "Invalid block size");
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}